

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O3

void __thiscall MT32Emu::BReverbModelImpl<short>::mute(BReverbModelImpl<short> *this)

{
  short *psVar1;
  uint uVar2;
  BReverbSettings *pBVar3;
  ulong uVar4;
  
  if (this->allpasses != (AllpassFilter<short> **)0x0) {
    uVar2 = this->currentSettings->numberOfAllpasses;
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        psVar1 = (this->allpasses[uVar4]->super_RingBuffer<short>).buffer;
        if (psVar1 != (short *)0x0) {
          memset(psVar1,0,(ulong)(this->allpasses[uVar4]->super_RingBuffer<short>).size * 2);
          uVar2 = this->currentSettings->numberOfAllpasses;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar2);
    }
  }
  if ((this->combs != (CombFilter<short> **)0x0) &&
     (pBVar3 = this->currentSettings, pBVar3->numberOfCombs != 0)) {
    uVar4 = 0;
    do {
      psVar1 = (this->combs[uVar4]->super_RingBuffer<short>).buffer;
      if (psVar1 != (short *)0x0) {
        memset(psVar1,0,(ulong)(this->combs[uVar4]->super_RingBuffer<short>).size * 2);
        pBVar3 = this->currentSettings;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < pBVar3->numberOfCombs);
  }
  return;
}

Assistant:

void mute() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				allpasses[i]->mute();
			}
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				combs[i]->mute();
			}
		}
	}